

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.h
# Opt level: O0

size_t __thiscall std::hash<arc::atom>::operator()(hash<arc::atom> *this,atom *a)

{
  bool bVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  double *pdVar4;
  atom *paVar5;
  _func_error_vector<arc::atom,_std::allocator<arc::atom>_>_ptr_atom_ptr **pp_Var6;
  _IO_FILE **pp_Var7;
  hash<void_*> local_d2;
  hash<arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*)>
  local_d1;
  atom local_d0;
  hash<arc::atom> local_a9;
  atom local_a8;
  hash<arc::atom> local_84;
  hash<double> local_83;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_82;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*> local_81;
  atom local_80;
  hash<arc::atom> local_5d [13];
  atom local_50;
  hash<arc::atom> local_29;
  hash<arc::atom> *local_28;
  size_t r;
  atom *a_local;
  hash<arc::atom> *this_local;
  
  local_28 = (hash<arc::atom> *)0x1;
  r = (size_t)a;
  a_local = (atom *)this;
  switch(a->type) {
  case T_NIL:
    this_local = (hash<arc::atom> *)0x0;
    break;
  case T_CONS:
    while (bVar1 = arc::no(a), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_28 = (hash<arc::atom> *)((long)local_28 * 0x1f);
      if (a->type != T_CONS) {
        arc::atom::atom(&local_80,a);
        sVar2 = operator()(local_5d,&local_80);
        local_28 = (hash<arc::atom> *)(sVar2 + (long)local_28);
        arc::atom::~atom(&local_80);
        break;
      }
      paVar5 = arc::car(a);
      arc::atom::atom(&local_50,paVar5);
      sVar2 = operator()(&local_29,&local_50);
      local_28 = (hash<arc::atom> *)(sVar2 + (long)local_28);
      arc::atom::~atom(&local_50);
      paVar5 = arc::cdr(a);
      arc::atom::operator=(a,paVar5);
    }
    this_local = local_28;
    break;
  case T_SYM:
    ppbVar3 = get<std::__cxx11::string*,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        (&a->val);
    this_local = (hash<arc::atom> *)
                 hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                 ::operator()(&local_81,*ppbVar3);
    break;
  case T_NUM:
    pdVar4 = get<double,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                       (&a->val);
    this_local = (hash<arc::atom> *)hash<double>::operator()(&local_83,*pdVar4);
    break;
  case T_BUILTIN:
    pp_Var6 = ___std__get<arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>_std__variant<std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>___
                        (&a->val);
    this_local = (hash<arc::atom> *)
                 hash<arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*)>
                 ::operator()(&local_d1,*pp_Var6);
    break;
  case T_CLOSURE:
    paVar5 = arc::cdr(a);
    arc::atom::atom(&local_a8,paVar5);
    this_local = (hash<arc::atom> *)operator()(&local_84,&local_a8);
    arc::atom::~atom(&local_a8);
    break;
  case T_MACRO:
    paVar5 = arc::cdr(a);
    arc::atom::atom(&local_d0,paVar5);
    this_local = (hash<arc::atom> *)operator()(&local_a9,&local_d0);
    arc::atom::~atom(&local_d0);
    break;
  case T_STRING:
    __s = arc::atom::asp<std::__cxx11::string>(a);
    this_local = (hash<arc::atom> *)
                 hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator()(&local_82,__s);
    break;
  case T_INPUT:
  case T_INPUT_PIPE:
  case T_OUTPUT:
    pp_Var7 = get<_IO_FILE*,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        (&a->val);
    this_local = (hash<arc::atom> *)hash<void_*>::operator()(&local_d2,*pp_Var7);
    break;
  default:
    this_local = (hash<arc::atom> *)0x0;
  }
  return (size_t)this_local;
}

Assistant:

size_t operator ()(arc::atom a) const {
			size_t r = 1;
			switch (a.type) {
			case arc::T_NIL:
				return 0;
			case arc::T_CONS:
				while (!no(a)) {
					r *= 31;
					if (a.type == arc::T_CONS) {
						r += hash<arc::atom>()(car(a));
						a = cdr(a);
					}
					else {
						r += hash<arc::atom>()(a);
						break;
					}
				}
				return r;
			case arc::T_SYM:
				return hash<arc::sym>()(std::get<arc::sym>(a.val));
			case arc::T_STRING: {
				return hash<string>()(a.asp<string>());
			}
			case arc::T_NUM: {
				return hash<double>()(std::get<double>(a.val));
			}
			case arc::T_CLOSURE:
				return hash<arc::atom>()(cdr(a));
			case arc::T_MACRO:
				return hash<arc::atom>()(cdr(a));
			case arc::T_BUILTIN:
				return hash<arc::builtin>()(std::get<arc::builtin>(a.val));
			case arc::T_INPUT:
			case arc::T_INPUT_PIPE:
			case arc::T_OUTPUT:
				return hash<void *>()(std::get<FILE *>(a.val));
			default:
				return 0;
			}
		}